

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastQueue.hpp
# Opt level: O1

optional<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>_>
* __thiscall
BCL::
FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
::push(optional<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>_>
       *__return_storage_ptr__,
      FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
      *this,vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
            *vals)

{
  pointer this_00;
  int iVar1;
  atomic_op<int> *in_R8;
  int iVar2;
  reference rVar3;
  GlobalPtr<int> ptr;
  GlobalPtr<const_int> src;
  GlobalPtr<int> ptr_00;
  GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
  dst;
  request request;
  remove_const_t<int> rv;
  request local_60;
  future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  local_58;
  
  local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(plus<int>::vtable + 0x28);
  local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(plus<int>::vtable + 0x60);
  local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(plus<int>::vtable + 0x98);
  ptr.ptr = (size_t)&local_60;
  ptr.rank = (this->tail).ptr;
  local_60.request_._0_4_ =
       (int)((ulong)((long)(vals->
                           super__Vector_base<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(vals->
                          super__Vector_base<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 5);
  iVar1 = fetch_and_op<int>((BCL *)(this->tail).rank,ptr,
                            (int *)&local_58.requests_.
                                    super__Vector_base<BCL::request,_std::allocator<BCL::request>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,in_R8);
  iVar2 = (int)((ulong)((long)(vals->
                              super__Vector_base<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(vals->
                             super__Vector_base<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) + iVar1;
  if (this->my_capacity < (ulong)((long)iVar2 - (long)this->head_buf)) {
    src.ptr = (size_t)&local_58;
    src.rank = (this->head).ptr;
    read<int>((BCL *)(this->head).rank,src,(int *)0x1,(size_t)in_R8);
    in_R8 = (atomic_op<int> *)(plus<int>::vtable + 0x28);
    this->head_buf =
         (int)local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (this->my_capacity <
        (ulong)(long)(iVar2 - (int)local_58.requests_.
                                   super__Vector_base<BCL::request,_std::allocator<BCL::request>_>.
                                   _M_impl.super__Vector_impl_data._M_start)) {
      local_60.request_._0_4_ =
           -(int)((ulong)((long)(vals->
                                super__Vector_base<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(vals->
                               super__Vector_base<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 5);
      local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)(plus<int>::vtable + 0x28);
      local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)(plus<int>::vtable + 0x60);
      local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)(plus<int>::vtable + 0x98);
      ptr_00.ptr = (size_t)&local_60;
      ptr_00.rank = (this->tail).ptr;
      fetch_and_op<int>((BCL *)(this->tail).rank,ptr_00,
                        (int *)&local_58.requests_.
                                super__Vector_base<BCL::request,_std::allocator<BCL::request>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
                        (atomic_op<int> *)(plus<int>::vtable + 0x28));
      (__return_storage_ptr__->
      super_OptionalBase<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char>,_int>_>_>_>
      ).init_ = false;
      (__return_storage_ptr__->
      super_OptionalBase<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char>,_int>_>_>_>
      ).storage_.dummy_ = '\0';
      return __return_storage_ptr__;
    }
  }
  local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(this->data).data.rank;
  local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(((ulong)(long)iVar1 % this->my_capacity) * 0x20 + (this->data).data.ptr);
  rVar3 = GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
          ::operator*((GlobalPtr<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>
                       *)&local_58);
  dst.rank = rVar3.ptr_.ptr;
  this_00 = (vals->
            super__Vector_base<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  dst.ptr = (long)(vals->
                  super__Vector_base<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)this_00 >> 5;
  local_60 = async_write<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>>
                       ((BCL *)this_00,
                        (HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>
                         *)rVar3.ptr_.rank,dst,(size_t)in_R8);
  future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>
  ::future(&local_58,vals,&local_60);
  (__return_storage_ptr__->
  super_OptionalBase<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char>,_int>_>_>_>
  ).init_ = true;
  (__return_storage_ptr__->
  super_OptionalBase<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char>,_int>_>_>_>
  ).storage_.value_.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super_OptionalBase<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char>,_int>_>_>_>
  ).storage_.value_.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super_OptionalBase<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char>,_int>_>_>_>
  ).storage_.value_.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_58.requests_.super__Vector_base<BCL::request,_std::allocator<BCL::request>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (__return_storage_ptr__->
  super_OptionalBase<BCL::future<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char>,_int>_>_>_>
  ).storage_.value_.value_._M_t.
  super___uniq_ptr_impl<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>,_std::default_delete<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_*,_std::default_delete<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>_>
  .
  super__Head_base<0UL,_std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_*,_false>
       = (_Head_base<0UL,_std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_*,_false>
          )local_58.value_._M_t.
           super___uniq_ptr_impl<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>,_std::default_delete<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_*,_std::default_delete<std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_>_>
           .
           super__Head_base<0UL,_std::vector<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_std::allocator<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>_>_>_*,_false>
           ._M_head_impl;
  return __return_storage_ptr__;
}

Assistant:

std::experimental::optional<future<std::vector<T>>> push(std::vector<T>&& vals) {
    int old_tail = BCL::fetch_and_op <int> (tail, vals.size(), BCL::plus <int> ());
    int new_tail = old_tail + vals.size();

    if (new_tail - head_buf > capacity()) {
      head_buf = BCL::rget(head);
      if (new_tail - head_buf > capacity()) {
        BCL::fetch_and_op <int> (tail, -vals.size(), BCL::plus <int> ());
        return {};
      }
    }
    BCL::GlobalPtr<T> data_ptr = BCL::decay_container(data.data);
    return BCL::arput(&data_ptr[old_tail % capacity()], std::move(vals));
  }